

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error asmjit::CodeHolder_evaluateExpression(CodeHolder *self,Expression *exp,uint64_t *out)

{
  Slot *pSVar1;
  Error EVar2;
  Slot *pSVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  uint64_t *extraout_RDX;
  ulong uVar7;
  Error EVar8;
  long lVar9;
  uint64_t value [2];
  Slot *local_38;
  
  EVar8 = 3;
  for (lVar9 = 1; lVar9 != 3; lVar9 = lVar9 + 1) {
    pSVar3 = (Slot *)(ulong)*(byte *)((long)(self->_allocator)._slots + lVar9 + -0x48);
    switch(pSVar3) {
    case (Slot *)0x0:
      break;
    case (Slot *)0x1:
      pSVar3 = (self->_allocator)._slots[lVar9 + -9];
      break;
    case (Slot *)0x2:
      pSVar3 = (self->_allocator)._slots[lVar9 + -9];
      pSVar1 = pSVar3[4].next;
      if (pSVar1 == (Slot *)0x0) {
        return 0x43;
      }
      pSVar3 = (Slot *)((long)&(pSVar1[2].next)->next + (long)&(pSVar3[3].next)->next);
      break;
    case (Slot *)0x3:
      EVar2 = CodeHolder_evaluateExpression
                        ((CodeHolder *)(self->_allocator)._slots[lVar9 + -9],(Expression *)&local_38
                         ,out);
      pSVar3 = local_38;
      out = extraout_RDX;
      if (EVar2 != 0) {
        return EVar2;
      }
      break;
    default:
      goto switchD_0010ff19_default;
    }
    value[lVar9 + -1] = (uint64_t)pSVar3;
  }
  bVar5 = (byte)value[1];
  switch((self->_environment)._arch) {
  case '\0':
    uVar4 = value[1] + value[0];
    break;
  case '\x01':
    uVar4 = value[0] - value[1];
    break;
  case '\x02':
    uVar4 = value[1] * value[0];
    break;
  case '\x03':
    uVar7 = value[0] << (bVar5 & 0x3f);
    goto LAB_0010ffaa;
  case '\x04':
    uVar7 = value[0] >> (bVar5 & 0x3f);
LAB_0010ffaa:
    uVar4 = 0;
    if (value[1] < 0x40) {
      uVar4 = uVar7;
    }
    break;
  case '\x05':
    bVar6 = 0x3f;
    if (value[1] < 0x3f) {
      bVar6 = bVar5;
    }
    uVar4 = (long)value[0] >> (bVar6 & 0x3f);
    break;
  default:
    return 3;
  }
  exp->opType = (char)uVar4;
  exp->valueType[0] = (char)(uVar4 >> 8);
  exp->valueType[1] = (char)(uVar4 >> 0x10);
  exp->reserved[0] = (char)(uVar4 >> 0x18);
  exp->reserved[1] = (char)(uVar4 >> 0x20);
  exp->reserved[2] = (char)(uVar4 >> 0x28);
  exp->reserved[3] = (char)(uVar4 >> 0x30);
  exp->reserved[4] = (char)(uVar4 >> 0x38);
  EVar8 = 0;
switchD_0010ff19_default:
  return EVar8;
}

Assistant:

static Error CodeHolder_evaluateExpression(CodeHolder* self, Expression* exp, uint64_t* out) noexcept {
  uint64_t value[2];
  for (size_t i = 0; i < 2; i++) {
    uint64_t v;
    switch (exp->valueType[i]) {
      case Expression::kValueNone: {
        v = 0;
        break;
      }

      case Expression::kValueConstant: {
        v = exp->value[i].constant;
        break;
      }

      case Expression::kValueLabel: {
        LabelEntry* le = exp->value[i].label;
        if (!le->isBound())
          return DebugUtils::errored(kErrorExpressionLabelNotBound);
        v = le->section()->offset() + le->offset();
        break;
      }

      case Expression::kValueExpression: {
        Expression* nested = exp->value[i].expression;
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(self, nested, &v));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    value[i] = v;
  }

  uint64_t result;
  uint64_t& a = value[0];
  uint64_t& b = value[1];

  switch (exp->opType) {
    case Expression::kOpAdd:
      result = a + b;
      break;

    case Expression::kOpSub:
      result = a - b;
      break;

    case Expression::kOpMul:
      result = a * b;
      break;

    case Expression::kOpSll:
      result = (b > 63) ? uint64_t(0) : uint64_t(a << b);
      break;

    case Expression::kOpSrl:
      result = (b > 63) ? uint64_t(0) : uint64_t(a >> b);
      break;

    case Expression::kOpSra:
      result = Support::sar(a, Support::min<uint64_t>(b, 63));
      break;

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  *out = result;
  return kErrorOk;
}